

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::Message,google::protobuf::internal::InternalMetadataWithArena>
          (ExtensionSet *this,char *ptr,Message *containing_type,InternalMetadataWithArena *metadata
          ,ParseContext *ctx)

{
  MessageFactory *pMVar1;
  StringPiece val;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_RCX;
  ParseContext *pPVar5;
  ParseContext *in_RSI;
  ParseContext *in_R8;
  int32 size;
  ParseContext tmp_ctx;
  char *p;
  MessageLite *value;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  uint64 tmp;
  uint32 tag;
  uint32 type_id;
  string payload;
  ParseContext *in_stack_fffffffffffffdd8;
  ParseContext *in_stack_fffffffffffffde0;
  ParseContext *in_stack_fffffffffffffde8;
  ParseContext *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  uint32 in_stack_fffffffffffffdfc;
  ParseContext *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_fffffffffffffe10;
  ParseContext *in_stack_fffffffffffffe20;
  Data *in_stack_fffffffffffffe28;
  DescriptorPool *in_stack_fffffffffffffe30;
  Data *in_stack_fffffffffffffe38;
  Data *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  ParseContext *in_stack_fffffffffffffe50;
  ParseContext *in_stack_fffffffffffffe58;
  ParseContext *in_stack_fffffffffffffe60;
  Container *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 local_150 [48];
  FieldDescriptor *in_stack_fffffffffffffee0;
  MessageLite *in_stack_fffffffffffffee8;
  FieldType in_stack_fffffffffffffef3;
  int in_stack_fffffffffffffef4;
  ExtensionSet *in_stack_fffffffffffffef8;
  DescriptorPool *in_stack_ffffffffffffff10;
  MessageFactory *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  ParseContext *in_stack_ffffffffffffff28;
  undefined1 local_b9 [2];
  byte local_b7;
  undefined4 local_94;
  undefined8 local_90;
  uint local_88;
  int local_74;
  string local_70 [32];
  ParseContext *local_50;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *local_48;
  ParseContext *local_38;
  ParseContext *local_28;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *local_20;
  Container *local_18;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *local_10;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *local_8;
  
  local_50 = in_R8;
  local_48 = in_RCX;
  local_38 = in_RSI;
  std::__cxx11::string::string(local_70);
  local_74 = 0;
  do {
    while( true ) {
      while( true ) {
        bVar2 = ParseContext::Done(in_stack_fffffffffffffde0,(char **)in_stack_fffffffffffffdd8);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          local_28 = local_38;
          goto LAB_00569254;
        }
        pPVar5 = (ParseContext *)((long)&(local_38->super_EpsCopyInputStream).limit_end_ + 1);
        local_88 = (uint)*(byte *)&(local_38->super_EpsCopyInputStream).limit_end_;
        local_38 = pPVar5;
        if (local_88 != 0x10) break;
        local_38 = (ParseContext *)
                   ParseBigVarint((char *)CONCAT44(in_stack_fffffffffffffdfc,
                                                   in_stack_fffffffffffffdf8),
                                  (uint64 *)in_stack_fffffffffffffdf0);
        if (local_38 == (ParseContext *)0x0) {
          local_28 = (ParseContext *)0x0;
          goto LAB_00569254;
        }
        local_74 = (int)local_90;
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          ExtensionInfo::ExtensionInfo((ExtensionInfo *)(local_b9 + 1));
          in_stack_fffffffffffffdd8 = (ParseContext *)local_b9;
          bVar2 = FindExtension((ExtensionSet *)in_stack_fffffffffffffe68,
                                (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                                (uint32)in_stack_fffffffffffffe60,
                                (Message *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                                (ExtensionInfo *)
                                CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                (bool *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80
                                                ));
          if (bVar2) {
            if ((local_b7 & 1) == 0) {
              in_stack_fffffffffffffe50 =
                   (ParseContext *)
                   MutableMessage(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                                  in_stack_fffffffffffffef3,in_stack_fffffffffffffee8,
                                  in_stack_fffffffffffffee0);
              in_stack_fffffffffffffe58 = in_stack_fffffffffffffe50;
            }
            else {
              in_stack_fffffffffffffe60 =
                   (ParseContext *)
                   AddMessage((ExtensionSet *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                              (FieldType)((uint)in_stack_ffffffffffffff20 >> 0x18),
                              (MessageLite *)in_stack_ffffffffffffff18,
                              (FieldDescriptor *)in_stack_ffffffffffffff10);
              in_stack_fffffffffffffe58 = in_stack_fffffffffffffe60;
            }
            in_stack_ffffffffffffff28 = in_stack_fffffffffffffe58;
            in_stack_fffffffffffffe4c = ParseContext::depth(local_50);
            ParseContext::ParseContext<std::__cxx11::string&>
                      (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                       SUB41((uint)in_stack_fffffffffffffdf8 >> 0x18,0),
                       (char **)in_stack_fffffffffffffdf0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffde8);
            in_stack_fffffffffffffe40 = ParseContext::data(local_50);
            in_stack_fffffffffffffe30 = in_stack_fffffffffffffe40->pool;
            in_stack_fffffffffffffe38 = ParseContext::data((ParseContext *)local_150);
            in_stack_fffffffffffffe38->pool = in_stack_fffffffffffffe30;
            in_stack_fffffffffffffe28 = ParseContext::data(local_50);
            pMVar1 = in_stack_fffffffffffffe28->factory;
            in_stack_fffffffffffffe20 =
                 (ParseContext *)ParseContext::data((ParseContext *)local_150);
            (in_stack_fffffffffffffe20->super_EpsCopyInputStream).buffer_end_ = (char *)pMVar1;
            iVar3 = (**(_func_int **)
                       ((long)(in_stack_ffffffffffffff28->super_EpsCopyInputStream).limit_end_ +
                       0x68))(in_stack_ffffffffffffff28,
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              local_150);
            in_stack_fffffffffffffe10 =
                 (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  *)CONCAT44(extraout_var,iVar3);
            if ((in_stack_fffffffffffffe10 ==
                 (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  *)0x0) ||
               (in_stack_fffffffffffffe0f =
                     EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)local_150),
               !(bool)in_stack_fffffffffffffe0f)) {
              local_28 = (ParseContext *)0x0;
              goto LAB_00569254;
            }
          }
          else {
            StringPiece::StringPiece<std::allocator<char>>
                      ((StringPiece *)in_stack_fffffffffffffde0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdd8);
            local_20 = local_48;
            local_10 = local_48;
            local_8 = local_48;
            in_stack_fffffffffffffe87 = ((uint)*(undefined8 *)local_48 & 1) == 1;
            if ((bool)in_stack_fffffffffffffe87) {
              local_18 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                         ::
                         PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                                   (local_48);
            }
            else {
              local_18 = (Container *)
                         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         ::mutable_unknown_fields_slow(in_stack_fffffffffffffe10);
            }
            val.ptr_._4_4_ = in_stack_fffffffffffffdfc;
            val.ptr_._0_4_ = in_stack_fffffffffffffdf8;
            val.length_ = (stringpiece_ssize_type)in_stack_fffffffffffffe00;
            in_stack_fffffffffffffe68 = local_18;
            WriteLengthDelimited
                      ((uint32)((ulong)in_stack_fffffffffffffdf0 >> 0x20),val,
                       (UnknownFieldSet *)in_stack_fffffffffffffde8);
          }
          local_74 = 0;
        }
      }
      if (local_88 != 0x1a) break;
      if (local_74 == 0) {
        in_stack_fffffffffffffdfc =
             ReadSize((char **)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
        if (local_38 == (ParseContext *)0x0) {
          local_28 = (ParseContext *)0x0;
          goto LAB_00569254;
        }
        in_stack_fffffffffffffdf0 =
             (ParseContext *)
             EpsCopyInputStream::ReadString
                       ((EpsCopyInputStream *)
                        CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                        (char *)in_stack_fffffffffffffdf0,
                        (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                        (string *)in_stack_fffffffffffffde0);
        local_38 = in_stack_fffffffffffffdf0;
        if (in_stack_fffffffffffffdf0 == (ParseContext *)0x0) {
          local_28 = (ParseContext *)0x0;
          goto LAB_00569254;
        }
      }
      else {
        in_stack_fffffffffffffe00 =
             (ParseContext *)
             ParseFieldMaybeLazily
                       ((ExtensionSet *)in_stack_fffffffffffffe00,
                        CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                        (char *)in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8,
                        (InternalMetadataWithArena *)in_stack_fffffffffffffde0,
                        in_stack_fffffffffffffdd8);
        local_38 = in_stack_fffffffffffffe00;
        if (in_stack_fffffffffffffe00 == (ParseContext *)0x0) {
          local_28 = (ParseContext *)0x0;
          goto LAB_00569254;
        }
        local_74 = 0;
      }
    }
    in_stack_fffffffffffffde8 =
         (ParseContext *)
         ReadTag((char *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                 (uint32 *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    local_38 = in_stack_fffffffffffffde8;
    if ((local_88 == 0) || ((local_88 & 7) == 4)) {
      EpsCopyInputStream::SetLastTag(&local_50->super_EpsCopyInputStream,local_88);
      local_28 = local_38;
      goto LAB_00569254;
    }
    in_stack_fffffffffffffde0 =
         (ParseContext *)
         ParseField((ExtensionSet *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                    (uint64)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                    (Message *)in_stack_fffffffffffffe30,
                    (InternalMetadataWithArena *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20
                   );
    local_38 = in_stack_fffffffffffffde0;
  } while (in_stack_fffffffffffffde0 != (ParseContext *)0x0);
  local_28 = (ParseContext *)0x0;
LAB_00569254:
  local_94 = 1;
  std::__cxx11::string::~string(local_70);
  return (char *)local_28;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(const char* ptr,
                                                  const Msg* containing_type,
                                                  Metadata* metadata,
                                                  internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}